

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

bool __thiscall re2::SparseArray<int>::has_index(SparseArray<int> *this,int i)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  int *piVar4;
  IndexValue *pIVar5;
  bool local_31;
  int i_local;
  SparseArray<int> *this_local;
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/sparse_array.h"
                  ,0x15e,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
  }
  iVar1 = max_size(this);
  if (i < iVar1) {
    uVar2 = max_size(this);
    if ((uint)i < uVar2) {
      puVar3 = (uint *)PODArray<int>::operator[](&this->sparse_,i);
      local_31 = false;
      if (*puVar3 < (uint)this->size_) {
        piVar4 = PODArray<int>::operator[](&this->sparse_,i);
        pIVar5 = PODArray<re2::SparseArray<int>::IndexValue>::operator[](&this->dense_,*piVar4);
        local_31 = pIVar5->index_ == i;
      }
      this_local._7_1_ = local_31;
    }
    else {
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  __assert_fail("i < max_size()",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/sparse_array.h"
                ,0x15f,"bool re2::SparseArray<int>::has_index(int) const [Value = int]");
}

Assistant:

bool SparseArray<Value>::has_index(int i) const {
  assert(i >= 0);
  assert(i < max_size());
  if (static_cast<uint32_t>(i) >= static_cast<uint32_t>(max_size())) {
    return false;
  }
  // Unsigned comparison avoids checking sparse_[i] < 0.
  return (uint32_t)sparse_[i] < (uint32_t)size_ &&
         dense_[sparse_[i]].index_ == i;
}